

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void search_switchable(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                      RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 *puVar4;
  long in_RDX;
  int in_ESI;
  double cost;
  int64_t bits;
  int64_t coeff_bits;
  int64_t coeff_pcost;
  int64_t sse;
  RestorationType r;
  RestorationType best_rtype;
  int64_t best_bits;
  double best_cost;
  int wiener_win;
  MACROBLOCK *x;
  RestUnitSearchInfo *rusi;
  RestSearchCtxt *rsc;
  WienerInfo *in_stack_ffffffffffffff70;
  WienerInfo *in_stack_ffffffffffffff78;
  SgrprojInfo *in_stack_ffffffffffffff80;
  long local_78;
  uint local_68;
  uint local_64;
  WienerInfo *local_60;
  WienerInfo *local_58;
  
  puVar4 = (undefined8 *)(*(long *)(in_RDX + 0x30) + (long)in_ESI * 0x40);
  lVar1 = *(long *)(in_RDX + 0x18);
  local_58 = (WienerInfo *)0x0;
  local_60 = (WienerInfo *)0x0;
  local_64 = 0;
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    if ((local_68 == 0) ||
       (*(long *)(in_RDX + 0x60 + (ulong)local_68 * 8) <= *(long *)(in_RDX + 0x60))) {
      lVar2 = *(long *)(in_RDX + 0x60 + (ulong)local_68 * 8);
      local_78 = 0;
      if (local_68 == 0) {
        local_78 = 0;
      }
      else if (local_68 == 1) {
        iVar3 = count_wiener_bits((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        local_78 = (long)iVar3;
      }
      else if (local_68 == 2) {
        iVar3 = count_sgrproj_bits(in_stack_ffffffffffffff80,
                                   (SgrprojInfo *)in_stack_ffffffffffffff78);
        local_78 = (long)iVar3;
      }
      in_stack_ffffffffffffff80 = (SgrprojInfo *)(local_78 * 0x200);
      in_stack_ffffffffffffff78 =
           (WienerInfo *)
           ((long)in_stack_ffffffffffffff80->xqd +
           (long)*(int *)(lVar1 + 0xb930 + (ulong)local_68 * 4) + -4);
      in_stack_ffffffffffffff70 =
           (WienerInfo *)
           ((double)(lVar2 >> (((char)*(undefined4 *)
                                       (*(long *)(*(long *)(in_RDX + 0x10) + 0x6088) + 0x48) + -8) *
                               '\x02' & 0x3fU)) * 128.0 +
           ((double)((long)in_stack_ffffffffffffff78 >> 4) * (double)*(int *)(lVar1 + 0x4218)) /
           512.0);
      if ((local_68 == 2) && (*(int *)(puVar4 + 4) < 10)) {
        in_stack_ffffffffffffff70 =
             (WienerInfo *)
             (((double)*(int *)(*(long *)(in_RDX + 0x38) + 0x14) * 0.01 + 1.0) *
             (double)in_stack_ffffffffffffff70);
      }
      if ((local_68 == 0) || ((double)in_stack_ffffffffffffff70 < (double)local_58)) {
        local_64 = local_68;
        local_60 = in_stack_ffffffffffffff78;
        local_58 = in_stack_ffffffffffffff70;
      }
    }
  }
  *(uint *)((long)puVar4 + 0x34) = local_64;
  *(long *)(in_RDX + 0x98) =
       *(long *)(in_RDX + 0x60 + (ulong)local_64 * 8) + *(long *)(in_RDX + 0x98);
  *(long *)(in_RDX + 0xb8) = (long)local_60->vfilter + *(long *)(in_RDX + 0xb8);
  if (local_64 == 1) {
    *(undefined8 *)(in_RDX + 0xf0) = *puVar4;
    *(undefined8 *)(in_RDX + 0xf8) = puVar4[1];
    *(undefined8 *)(in_RDX + 0x100) = puVar4[2];
    *(undefined8 *)(in_RDX + 0x108) = puVar4[3];
  }
  if (local_64 == 2) {
    *(undefined8 *)(in_RDX + 0x110) = puVar4[4];
    *(undefined4 *)(in_RDX + 0x118) = *(undefined4 *)(puVar4 + 5);
  }
  return;
}

Assistant:

static inline void search_switchable(
    const RestorationTileLimits *limits, int rest_unit_idx, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs,
    struct aom_internal_error_info *error_info) {
  (void)limits;
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  double best_cost = 0;
  int64_t best_bits = 0;
  RestorationType best_rtype = RESTORE_NONE;

  for (RestorationType r = 0; r < RESTORE_SWITCHABLE_TYPES; ++r) {
    // If this restoration mode was skipped, or could not find a solution
    // that was better than RESTORE_NONE, then we can't select it here either.
    //
    // Note: It is possible for the restoration search functions to find a
    // filter which is better than RESTORE_NONE when looking purely at SSE, but
    // for it to be rejected overall due to its rate cost. In this case, there
    // is a chance that it may be have a lower rate cost when looking at
    // RESTORE_SWITCHABLE, and so it might be acceptable here.
    //
    // Therefore we prune based on SSE, rather than on whether or not the
    // previous search function selected this mode.
    if (r > RESTORE_NONE) {
      if (rsc->sse[r] > rsc->sse[RESTORE_NONE]) continue;
    }

    const int64_t sse = rsc->sse[r];
    int64_t coeff_pcost = 0;
    switch (r) {
      case RESTORE_NONE: coeff_pcost = 0; break;
      case RESTORE_WIENER:
        coeff_pcost = count_wiener_bits(wiener_win, &rusi->wiener,
                                        &rsc->switchable_ref_wiener);
        break;
      case RESTORE_SGRPROJ:
        coeff_pcost =
            count_sgrproj_bits(&rusi->sgrproj, &rsc->switchable_ref_sgrproj);
        break;
      default: assert(0); break;
    }
    const int64_t coeff_bits = coeff_pcost << AV1_PROB_COST_SHIFT;
    const int64_t bits = x->mode_costs.switchable_restore_cost[r] + coeff_bits;
    double cost = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits >> 4, sse, rsc->cm->seq_params->bit_depth);
    if (r == RESTORE_SGRPROJ && rusi->sgrproj.ep < 10)
      cost *= (1 + DUAL_SGR_PENALTY_MULT * rsc->lpf_sf->dual_sgr_penalty_level);
    if (r == 0 || cost < best_cost) {
      best_cost = cost;
      best_bits = bits;
      best_rtype = r;
    }
  }

  rusi->best_rtype[RESTORE_SWITCHABLE - 1] = best_rtype;

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].wiener_info =
      rsc->switchable_ref_wiener;
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].sgrproj_info =
      rsc->switchable_ref_sgrproj;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_SWITCHABLE] += rsc->sse[best_rtype];
  rsc->total_bits[RESTORE_SWITCHABLE] += best_bits;
  if (best_rtype == RESTORE_WIENER) rsc->switchable_ref_wiener = rusi->wiener;
  if (best_rtype == RESTORE_SGRPROJ)
    rsc->switchable_ref_sgrproj = rusi->sgrproj;
}